

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

int LogLuvDecode32(TIFF *tif,uint8_t *op,tmsize_t occ,uint16_t s)

{
  byte bVar1;
  uint8_t *puVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  long lVar6;
  byte *pbVar7;
  bool bVar8;
  uint local_74;
  tmsize_t tStack_70;
  int rc;
  tmsize_t cc;
  uint8_t *puStack_60;
  uint32_t b;
  uint32_t *tp;
  uchar *bp;
  tmsize_t npixels;
  tmsize_t i;
  int shft;
  LogLuvState *sp;
  uint16_t s_local;
  tmsize_t occ_local;
  uint8_t *op_local;
  TIFF *tif_local;
  
  if (s != 0) {
    __assert_fail("s == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x146,"int LogLuvDecode32(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  puVar2 = tif->tif_data;
  if (puVar2 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x148,"int LogLuvDecode32(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  lVar6 = occ / (long)*(int *)(puVar2 + 0xc);
  puStack_60 = op;
  if (*(int *)(puVar2 + 4) != 2) {
    if (*(long *)(puVar2 + 0x18) < lVar6) {
      TIFFErrorExtR(tif,"LogLuvDecode32","Translation buffer too short");
      return 0;
    }
    puStack_60 = *(uint8_t **)(puVar2 + 0x10);
  }
  _TIFFmemset(puStack_60,0,lVar6 << 2);
  tp = (uint32_t *)tif->tif_rawcp;
  tStack_70 = tif->tif_rawcc;
  i._4_4_ = 0x18;
  do {
    if (i._4_4_ < 0) {
      (**(code **)(puVar2 + 0x20))(puVar2,op,lVar6);
      tif->tif_rawcp = (uint8_t *)tp;
      tif->tif_rawcc = tStack_70;
      return 1;
    }
    npixels = 0;
    while (npixels < lVar6 && 0 < tStack_70) {
      if ((byte)*tp < 0x80) {
        local_74 = (uint)(byte)*tp;
        while( true ) {
          tp = (uint32_t *)((long)tp + 1);
          tStack_70 = tStack_70 + -1;
          bVar3 = false;
          if (tStack_70 != 0) {
            uVar5 = local_74 - 1;
            bVar8 = local_74 != 0;
            bVar3 = false;
            local_74 = uVar5;
            if (bVar8) {
              bVar3 = npixels < lVar6;
            }
          }
          if (!bVar3) break;
          *(uint *)(puStack_60 + npixels * 4) =
               (uint)*(byte *)tp << ((byte)i._4_4_ & 0x1f) | *(uint *)(puStack_60 + npixels * 4);
          npixels = npixels + 1;
        }
      }
      else {
        if (tStack_70 < 2) break;
        pbVar7 = (byte *)((long)tp + 1);
        uVar4 = *tp;
        tp = (uint32_t *)((long)tp + 2);
        bVar1 = *pbVar7;
        tStack_70 = tStack_70 + -2;
        local_74 = (byte)uVar4 - 0x7e;
        while (local_74 != 0 && npixels < lVar6) {
          *(uint *)(puStack_60 + npixels * 4) =
               (uint)bVar1 << ((byte)i._4_4_ & 0x1f) | *(uint *)(puStack_60 + npixels * 4);
          local_74 = local_74 + -1;
          npixels = npixels + 1;
        }
      }
    }
    if (npixels != lVar6) {
      TIFFErrorExtR(tif,"LogLuvDecode32","Not enough data at row %u (short %ld pixels)",
                    (ulong)tif->tif_row,lVar6 - npixels);
      tif->tif_rawcp = (uint8_t *)tp;
      tif->tif_rawcc = tStack_70;
      return 0;
    }
    i._4_4_ = i._4_4_ + -8;
  } while( true );
}

Assistant:

static int LogLuvDecode32(TIFF *tif, uint8_t *op, tmsize_t occ, uint16_t s)
{
    static const char module[] = "LogLuvDecode32";
    LogLuvState *sp;
    int shft;
    tmsize_t i;
    tmsize_t npixels;
    unsigned char *bp;
    uint32_t *tp;
    uint32_t b;
    tmsize_t cc;
    int rc;

    (void)s;
    assert(s == 0);
    sp = DecoderState(tif);
    assert(sp != NULL);

    npixels = occ / sp->pixel_size;

    if (sp->user_datafmt == SGILOGDATAFMT_RAW)
        tp = (uint32_t *)op;
    else
    {
        if (sp->tbuflen < npixels)
        {
            TIFFErrorExtR(tif, module, "Translation buffer too short");
            return (0);
        }
        tp = (uint32_t *)sp->tbuf;
    }
    _TIFFmemset((void *)tp, 0, npixels * sizeof(tp[0]));

    bp = (unsigned char *)tif->tif_rawcp;
    cc = tif->tif_rawcc;
    /* get each byte string */
    for (shft = 24; shft >= 0; shft -= 8)
    {
        for (i = 0; i < npixels && cc > 0;)
        {
            if (*bp >= 128)
            { /* run */
                if (cc < 2)
                    break;
                rc = *bp++ + (2 - 128);
                b = (uint32_t)*bp++ << shft;
                cc -= 2;
                while (rc-- && i < npixels)
                    tp[i++] |= b;
            }
            else
            {               /* non-run */
                rc = *bp++; /* nul is noop */
                while (--cc && rc-- && i < npixels)
                    tp[i++] |= (uint32_t)*bp++ << shft;
            }
        }
        if (i != npixels)
        {
            TIFFErrorExtR(tif, module,
                          "Not enough data at row %" PRIu32
                          " (short %" TIFF_SSIZE_FORMAT " pixels)",
                          tif->tif_row, npixels - i);
            tif->tif_rawcp = (uint8_t *)bp;
            tif->tif_rawcc = cc;
            return (0);
        }
    }
    (*sp->tfunc)(sp, op, npixels);
    tif->tif_rawcp = (uint8_t *)bp;
    tif->tif_rawcc = cc;
    return (1);
}